

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void serialize_combined<_IO_FILE*>
               (IsoForest *model,ExtIsoForest *model_ext,Imputer *imputer,TreesIndexer *indexer,
               char *optional_metadata,size_t size_optional_metadata,_IO_FILE **out)

{
  long saved_position;
  long saved_position_00;
  runtime_error *this;
  uint8_t model_type;
  uint8_t ending_type;
  size_t local_68;
  size_t size_optional_metadata_local;
  SignalSwitcher ss;
  size_t jump_ahead;
  
  size_optional_metadata_local = size_optional_metadata;
  SignalSwitcher::SignalSwitcher(&ss);
  saved_position = ftell((FILE *)*out);
  add_setup_info<_IO_FILE*>(out,false);
  model_type = '\x04';
  write_bytes<unsigned_char>(&model_type,1,out);
  if (model == (IsoForest *)0x0) {
    if (model_ext == (ExtIsoForest *)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Must pass one of \'model\' or \'model_ext\'.\n");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (size_optional_metadata == 0) {
      if (imputer == (Imputer *)0x0) {
        if (indexer == (TreesIndexer *)0x0) {
          model_type = '\x02';
        }
        else {
          model_type = '\x0e';
        }
      }
      else if (indexer == (TreesIndexer *)0x0) {
        model_type = '\x05';
      }
      else {
        model_type = '\x0f';
      }
    }
    else if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        model_type = '\a';
      }
      else {
        model_type = '\x11';
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      model_type = '\t';
    }
    else {
      model_type = '\x13';
    }
  }
  else if (size_optional_metadata == 0) {
    if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        model_type = '\x01';
      }
      else {
        model_type = '\f';
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      model_type = '\x04';
    }
    else {
      model_type = '\r';
    }
  }
  else if (imputer == (Imputer *)0x0) {
    if (indexer == (TreesIndexer *)0x0) {
      model_type = '\x06';
    }
    else {
      model_type = '\x10';
    }
  }
  else if (indexer == (TreesIndexer *)0x0) {
    model_type = '\b';
  }
  else {
    model_type = '\x12';
  }
  write_bytes<unsigned_char>(&model_type,1,out);
  if (model == (IsoForest *)0x0) {
    local_68 = get_size_model(model_ext);
  }
  else {
    local_68 = get_size_model(model);
  }
  write_bytes<unsigned_long>(&local_68,1,out);
  if (imputer == (Imputer *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = get_size_model(imputer);
  }
  write_bytes<unsigned_long>(&local_68,1,out);
  if (indexer == (TreesIndexer *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = get_size_model(indexer);
  }
  write_bytes<unsigned_long>(&local_68,1,out);
  write_bytes<unsigned_long>(&size_optional_metadata_local,1,out);
  check_interrupt_switch(&ss);
  if (model == (IsoForest *)0x0) {
    serialize_model<_IO_FILE*>(model_ext,out);
  }
  else {
    serialize_model<_IO_FILE*>(model,out);
  }
  if (imputer != (Imputer *)0x0) {
    serialize_model<_IO_FILE*>(imputer,out);
  }
  if (indexer != (TreesIndexer *)0x0) {
    serialize_model<_IO_FILE*>(indexer,out);
  }
  if (size_optional_metadata_local != 0) {
    write_bytes<char>(optional_metadata,size_optional_metadata_local,out);
  }
  check_interrupt_switch(&ss);
  ending_type = '\0';
  write_bytes<unsigned_char>(&ending_type,1,out);
  jump_ahead = 0;
  write_bytes<unsigned_long>(&jump_ahead,1,out);
  saved_position_00 = ftell((FILE *)*out);
  return_to_position(out,saved_position);
  add_full_watermark<_IO_FILE*>(out);
  return_to_position(out,saved_position_00);
  SignalSwitcher::~SignalSwitcher(&ss);
  return;
}

Assistant:

void serialize_combined
(
    const IsoForest *model,
    const ExtIsoForest *model_ext,
    const Imputer *imputer,
    const TreesIndexer *indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata,
    otype &out
)
{
    SignalSwitcher ss = SignalSwitcher();

    auto pos_watermark = set_return_position(out);

    add_setup_info(out, false);
    uint8_t model_type = AllObjectsCombined;
    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);

    if (model != NULL)
    {

        if (!size_optional_metadata)
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasSingleVarModelNext;
                else
                    model_type = HasSingleVarModelPlusIndexerNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusImputerNext;
                else
                    model_type = HasSingleVarModelPlusImputerPlusIndexerNext;
            }
        }

        else
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusMetadataNext;
                else
                    model_type = HasSingleVarModelPlusIndexerPlusMetadataNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusImputerPlusMetadataNext;
                else
                    model_type = HasSingleVarModelPlusImputerPlusIndexerPlusMetadataNext;
            }
        }

    }

    else if (model_ext != NULL)
    {

        if (!size_optional_metadata)
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasExtModelNext;
                else
                    model_type = HasExtModelPlusIndexerNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasExtModelPlusImputerNext;
                else
                    model_type = HasExtModelPlusImputerPlusIndexerNext;
            }
        }

        else
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasExtModelPlusMetadataNext;
                else
                    model_type = HasExtModelPlusIndexerPlusMetadataNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasExtModelPlusImputerPlusMetadataNext;
                else
                    model_type = HasExtModelPlusImputerPlusIndexerPlusMetadataNext;
            }
        }
    }

    else {
        throw std::runtime_error("Must pass one of 'model' or 'model_ext'.\n");
    }

    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);

    size_t size_model;
    if (model != NULL)
        size_model = get_size_model(*model);
    else
        size_model = get_size_model(*model_ext);
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    if (imputer != NULL)
        size_model = get_size_model(*imputer);
    else
        size_model = 0;
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    if (indexer != NULL)
        size_model = get_size_model(*indexer);
    else
        size_model = 0;
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    write_bytes<size_t>((void*)&size_optional_metadata, (size_t)1, out);


    check_interrupt_switch(ss);

    if (model != NULL)
        serialize_model(*model, out);
    else
        serialize_model(*model_ext, out);

    if (imputer != NULL)
        serialize_model(*imputer, out);

    if (indexer != NULL)
        serialize_model(*indexer, out);

    if (size_optional_metadata)
        write_bytes<char>((void*)optional_metadata, size_optional_metadata, out);

    check_interrupt_switch(ss);

    uint8_t ending_type = (uint8_t)EndsHere;
    write_bytes<uint8_t>((void*)&ending_type, (size_t)1, out);
    size_t jump_ahead = 0;
    write_bytes<size_t>((void*)&jump_ahead, (size_t)1, out);

    auto end_pos = set_return_position(out);
    return_to_position(out, pos_watermark);
    add_full_watermark(out);
    return_to_position(out, end_pos);
}